

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

int __thiscall
slang::ast::AssertionPortSymbol::clone
          (AssertionPortSymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *pSVar1;
  AssertionPortSymbol *this_00;
  
  this_00 = BumpAllocator::
            emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                      (*(BumpAllocator **)__fn,&(this->super_Symbol).name,
                       &(this->super_Symbol).location);
  DeclaredType::setLink(&this_00->declaredType,&this->declaredType);
  this_00->defaultValueSyntax = this->defaultValueSyntax;
  (this_00->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::ArgumentDirection> =
       (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ast::ArgumentDirection>;
  pSVar1 = (this->super_Symbol).originatingSyntax;
  if (pSVar1 != (SyntaxNode *)0x0) {
    (this_00->super_Symbol).originatingSyntax = pSVar1;
    Symbol::setAttributes
              (&this_00->super_Symbol,(Scope *)__fn,
               *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *
                )&pSVar1[2].previewNode);
  }
  return (int)this_00;
}

Assistant:

AssertionPortSymbol& AssertionPortSymbol::clone(Scope& newScope) const {
    auto& comp = newScope.getCompilation();
    auto result = comp.emplace<AssertionPortSymbol>(name, location);
    result->declaredType.setLink(declaredType);
    result->defaultValueSyntax = defaultValueSyntax;
    result->direction = direction;

    if (auto syntax = getSyntax()) {
        result->setSyntax(*syntax);
        result->setAttributes(newScope, syntax->as<AssertionItemPortSyntax>().attributes);
    }

    return *result;
}